

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::InlineBuiltInLibraryCall(Lowerer *this,Instr *callInstr)

{
  Opnd *pOVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  BuiltinFunction BVar5;
  ArgSlot AVar6;
  int iVar7;
  SymOpnd *pSVar8;
  StackSym *pSVar9;
  undefined4 *puVar10;
  Instr *pIVar11;
  LabelInstr *target;
  RegOpnd *pRVar12;
  Lowerer *pLVar13;
  MemRefOpnd *compareSrc2;
  LabelInstr *doneLabel;
  BranchInstr *instr;
  char *callInstr_00;
  Lowerer *this_00;
  long lVar14;
  Opnd **ppOVar15;
  undefined8 in_stack_ffffffffffffff78;
  uint uVar16;
  LabelInstr *doneLabel_00;
  LabelInstr *in_stack_ffffffffffffff80;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_68;
  undefined6 uStack_66;
  Opnd *argsOpnd [3];
  
  uVar16 = (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  pLVar13 = (Lowerer *)callInstr->m_src1;
  pOVar1 = callInstr->m_src2;
  bVar4 = IR::Opnd::IsSymOpnd(pOVar1);
  if (!bVar4) {
    return false;
  }
  ppOVar15 = &callInstr->m_src2;
  pSVar8 = IR::Opnd::AsSymOpnd(pOVar1);
  pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
  AVar6 = StackSym::GetArgSlotNum(pSVar9);
  lVar14 = (ulong)AVar6 - 1;
  BVar5 = Func::GetBuiltInIndex((Opnd *)pLVar13);
  argsOpnd[2] = (Opnd *)(ulong)BVar5._value;
  if ((BVar5._value - 8 < 2) || (BVar5._value == '\0')) {
    if (lVar14 != 1) {
      return false;
    }
    if (callInstr->m_dst == (Opnd *)0x0) {
      return false;
    }
  }
  else if (BVar5._value == '\x11') {
    if (lVar14 != 2) {
      return false;
    }
    bVar4 = ShouldGenerateStringReplaceFastPath(pLVar13,callInstr,2);
    if (!bVar4) {
      return false;
    }
  }
  else {
    if (BVar5._value != ')') {
      return false;
    }
    if (lVar14 != 1) {
      return false;
    }
    if (callInstr->m_dst != (Opnd *)0x0) {
      return false;
    }
    pSVar8 = IR::Opnd::AsSymOpnd(*ppOVar15);
    pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
    pIVar11 = (pSVar9->field_5).m_instrDef;
    if ((pSVar9->field_0x18 & pIVar11 != (Instr *)0x0) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2e71,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
      if (!bVar4) goto LAB_0057548a;
      *puVar10 = 0;
      pIVar11 = (pSVar9->field_5).m_instrDef;
    }
    pSVar8 = IR::Opnd::AsSymOpnd(pIVar11->m_src2);
    pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
    pIVar11 = (pSVar9->field_5).m_instrDef;
    if ((pSVar9->field_0x18 & pIVar11 != (Instr *)0x0) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2e73,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
      if (!bVar4) goto LAB_0057548a;
      *puVar10 = 0;
      pIVar11 = (pSVar9->field_5).m_instrDef;
    }
    pLVar13 = (Lowerer *)pIVar11->m_src1;
    this_00 = pLVar13;
    bVar4 = IR::Opnd::IsRegOpnd((Opnd *)pLVar13);
    if ((!bVar4) ||
       (bVar4 = ShouldGenerateArrayFastPath(this_00,(Opnd *)pLVar13,false,false,false), !bVar4)) {
      return false;
    }
    local_68 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(pLVar13->m_lowererMD).FloatPrefThreshold;
    bVar4 = ValueType::IsLikelyNativeArray((ValueType *)&local_68.field_0);
    if (bVar4) {
      return false;
    }
  }
  bVar4 = Func::IsBuiltInInlinedInLowerer(callInstr->m_src1);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2e9a,"(Func::IsBuiltInInlinedInLowerer(callInstr->GetSrc1()))",
                       "Func::IsBuiltInInlinedInLowerer(callInstr->GetSrc1())");
    if (!bVar4) goto LAB_0057548a;
    *puVar10 = 0;
  }
  pOVar1 = callInstr->m_src1;
  target = IR::LabelInstr::New(Label,this->m_func,true);
  pRVar12 = IR::Opnd::AsRegOpnd(pOVar1);
  pLVar13 = (Lowerer *)GetObjRefForBuiltInTarget(this,pRVar12);
  compareSrc2 = IR::MemRefOpnd::New(pLVar13,TyInt64,this->m_func,AddrOpndKindDynamicMisc);
  doneLabel_00 = (LabelInstr *)((ulong)uVar16 << 0x20);
  callInstr_00 = (char *)0xd;
  pIVar11 = callInstr;
  InsertCompareBranch(pLVar13,pOVar1,&compareSrc2->super_Opnd,BrNeq_A,target,callInstr,false);
  IR::Instr::InsertBefore(callInstr,&target->super_Instr);
  if (AVar6 < 4) {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    callInstr_00 = "argCount <= 2";
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ea6,"(argCount <= 2)","argCount <= 2");
    if (!bVar4) goto LAB_0057548a;
    *puVar10 = 0;
  }
  while( true ) {
    pOVar1 = *ppOVar15;
    bVar4 = IR::Opnd::IsSymOpnd(pOVar1);
    if (!bVar4) break;
    pSVar8 = IR::Opnd::AsSymOpnd(pOVar1);
    pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
    if ((pSVar9->field_0x18 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      callInstr_00 = "sym->m_isSingleDef";
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2eaf,"(sym->m_isSingleDef)","sym->m_isSingleDef");
      if (!bVar4) goto LAB_0057548a;
      *puVar10 = 0;
    }
    pIVar2 = (pSVar9->field_5).m_instrDef;
    if (lVar14 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      callInstr_00 = "argCount >= 0";
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2eb2,"(argCount >= 0)","argCount >= 0");
      if (!bVar4) goto LAB_0057548a;
      *puVar10 = 0;
    }
    *(Opnd **)(&local_68 + lVar14 * 4) = pIVar2->m_src1;
    lVar14 = lVar14 + -1;
    IR::Instr::Unlink(pIVar2);
    IR::Instr::InsertAfter(&target->super_Instr,pIVar2);
    ppOVar15 = &pIVar2->m_src2;
  }
  if (lVar14 != -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    callInstr_00 = "argCount == -1";
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ebb,"(argCount == -1)","argCount == -1");
    if (!bVar4) goto LAB_0057548a;
    *puVar10 = 0;
  }
  bVar4 = IR::Opnd::IsRegOpnd(pOVar1);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    callInstr_00 = "linkOpnd->IsRegOpnd()";
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ebe,"(linkOpnd->IsRegOpnd())","linkOpnd->IsRegOpnd()");
    if (!bVar4) goto LAB_0057548a;
    *puVar10 = 0;
  }
  pRVar12 = IR::Opnd::AsRegOpnd(pOVar1);
  pSVar9 = pRVar12->m_sym;
  if ((pSVar9->field_0x18 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    callInstr_00 = "sym->m_isSingleDef";
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ec0,"(sym->m_isSingleDef)","sym->m_isSingleDef");
    if (!bVar4) goto LAB_0057548a;
    *puVar10 = 0;
  }
  pIVar2 = (pSVar9->field_5).m_instrDef;
  if (pIVar2->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    callInstr_00 = "startCall->m_opcode == Js::OpCode::StartCall";
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ec2,"(startCall->m_opcode == Js::OpCode::StartCall)",
                       "startCall->m_opcode == Js::OpCode::StartCall");
    if (!bVar4) goto LAB_0057548a;
    *puVar10 = 0;
  }
  IR::Instr::Unlink(pIVar2);
  IR::Instr::InsertAfter(&target->super_Instr,pIVar2);
  doneLabel = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::InsertAfter(callInstr,&doneLabel->super_Instr);
  if (BVar5._value - 8 < 2) {
    bVar4 = GenerateFastCharAt(this,(BuiltinFunction)(byte)argsOpnd[2],callInstr->m_dst,
                               (Opnd *)CONCAT62(uStack_66,local_68.bits),argsOpnd[0],pIVar11,
                               &target->super_Instr,target,doneLabel);
  }
  else {
    iVar7 = (int)argsOpnd[2];
    if (iVar7 == 0x29) {
      GenerateFastPush(this,(Opnd *)CONCAT62(uStack_66,local_68.bits),argsOpnd[0],
                       (Instr *)callInstr_00,&target->super_Instr,target,doneLabel_00,doneLabel,
                       false);
    }
    else if (iVar7 == 0x11) {
      GenerateFastReplace(this,(Opnd *)CONCAT62(uStack_66,local_68.bits),argsOpnd[0],argsOpnd[1],
                          callInstr,&target->super_Instr,target,in_stack_ffffffffffffff80);
    }
    else if (iVar7 == 0) {
      LowererMD::GenerateFastAbs
                (&this->m_lowererMD,callInstr->m_dst,argsOpnd[0],callInstr,&target->super_Instr,
                 target,doneLabel);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,12000,"((0))","UNREACHED");
      if (!bVar4) {
LAB_0057548a:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar10 = 0;
    }
    bVar4 = true;
  }
  instr = IR::BranchInstr::New(JMP,doneLabel,this->m_func);
  IR::Instr::InsertBefore(&target->super_Instr,&instr->super_Instr);
  return bVar4;
}

Assistant:

bool
Lowerer::InlineBuiltInLibraryCall(IR::Instr *callInstr)
{
    IR::Opnd *src1 = callInstr->GetSrc1();
    IR::Opnd *src2 = callInstr->GetSrc2();

    // Get the arg count by looking at the slot number of the last arg symbol.

    if (!src2->IsSymOpnd())
    {
        // No args? Not sure this is possible, but handle it.
        return false;
    }

    StackSym *argLinkSym = src2->AsSymOpnd()->m_sym->AsStackSym();
    // Subtract "this" from the arg count.
    IntConstType argCount = argLinkSym->GetArgSlotNum() - 1;

    // Find the callee's built-in index (if any).
    Js::BuiltinFunction index = Func::GetBuiltInIndex(src1);

    // Warning!
    // Don't add new built-in to following switch. Built-ins needs to be inlined in call direct way.
    // Following is only for prejit scenarios where we don't get inlining always and generate fast path in lowerer.
    // Generating fastpath here misses fixed functions and globopt optimizations.
    switch(index)
    {
        case Js::BuiltinFunction::JavascriptString_CharAt:
        case Js::BuiltinFunction::JavascriptString_CharCodeAt:
            if (argCount != 1)
            {
                return false;
            }
            if (!callInstr->GetDst())
            {
                // Optimization of Char[Code]At assumes result is used.
                return false;
            }
            break;
        case Js::BuiltinFunction::Math_Abs:
#ifdef _M_IX86
            if (!AutoSystemInfo::Data.SSE2Available())
            {
                return false;
            }
#endif
            if (argCount != 1)
            {
                return false;
            }
            if (!callInstr->GetDst())
            {
                // Optimization of Abs assumes result is used.
                return false;
            }
            break;

        case Js::BuiltinFunction::JavascriptArray_Push:
        {
            if (argCount != 1)
            {
                return false;
            }
            if (callInstr->GetDst())
            {
                // Optimization of push assumes result is unused.
                return false;
            }

            StackSym *linkSym = callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
            Assert(linkSym->IsSingleDef());
            linkSym = linkSym->m_instrDef->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
            Assert(linkSym->IsSingleDef());

            IR::Opnd *const arrayOpnd = linkSym->m_instrDef->GetSrc1();
            if(!arrayOpnd->IsRegOpnd())
            {
                // This should be rare, but needs to be handled.
                // By now, we've already started some of the inlining.  Simply jmp to the helper.
                // The branch will get peeped later.
                return false;
            }

            if(!ShouldGenerateArrayFastPath(arrayOpnd, false, false, false) ||
               arrayOpnd->GetValueType().IsLikelyNativeArray())
            {
                // Rejecting native array for now, since we have to do a FromVar at the call site and bail out.
                return false;
            }

            break;
        }

        case Js::BuiltinFunction::JavascriptString_Replace:
        {
            if(argCount != 2)
            {
                return false;
            }

            if(!ShouldGenerateStringReplaceFastPath(callInstr, argCount))
            {
                return false;
            }
            break;
        }

        default:
            return false;
    }

    Assert(Func::IsBuiltInInlinedInLowerer(callInstr->GetSrc1()));

    IR::Opnd *callTargetOpnd = callInstr->GetSrc1();

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    IR::Opnd *objRefOpnd = IR::MemRefOpnd::New((void*)this->GetObjRefForBuiltInTarget(callTargetOpnd->AsRegOpnd()), TyMachReg, this->m_func);

    InsertCompareBranch(callTargetOpnd, objRefOpnd, Js::OpCode::BrNeq_A, labelHelper, callInstr);

    callInstr->InsertBefore(labelHelper);

    Assert(argCount <= 2);

    IR::Opnd *argsOpnd[3];
    IR::Opnd *linkOpnd = callInstr->GetSrc2();

    while(linkOpnd->IsSymOpnd())
    {
        IR::SymOpnd * symOpnd = linkOpnd->AsSymOpnd();
        StackSym *sym = symOpnd->m_sym->AsStackSym();
        Assert(sym->m_isSingleDef);
        IR::Instr *argInstr = sym->m_instrDef;

        Assert(argCount >= 0);
        argsOpnd[argCount] = argInstr->GetSrc1();
        argCount--;

        argInstr->Unlink();
        labelHelper->InsertAfter(argInstr);

        linkOpnd = argInstr->GetSrc2();
    }
    AnalysisAssert(argCount == -1);

    //  Move startcall
    Assert(linkOpnd->IsRegOpnd());
    StackSym *sym = linkOpnd->AsRegOpnd()->m_sym;
    Assert(sym->m_isSingleDef);
    IR::Instr *startCall = sym->m_instrDef;
    Assert(startCall->m_opcode == Js::OpCode::StartCall);
    startCall->Unlink();
    labelHelper->InsertAfter(startCall);

    // $doneLabel:
    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    callInstr->InsertAfter(doneLabel);

    bool success = true;
    switch(index)
    {
        case Js::BuiltinFunction::Math_Abs:
            this->m_lowererMD.GenerateFastAbs(callInstr->GetDst(), argsOpnd[1], callInstr, labelHelper, labelHelper, doneLabel);
            break;

        case Js::BuiltinFunction::JavascriptString_CharCodeAt:
        case Js::BuiltinFunction::JavascriptString_CharAt:
            success = GenerateFastCharAt(index, callInstr->GetDst(), argsOpnd[0], argsOpnd[1],
                callInstr, labelHelper, labelHelper, doneLabel);
            break;

        case Js::BuiltinFunction::JavascriptArray_Push:
            success = GenerateFastPush(argsOpnd[0], argsOpnd[1], callInstr, labelHelper, labelHelper, nullptr, doneLabel);
            break;

        case Js::BuiltinFunction::JavascriptString_Replace:
            success = GenerateFastReplace(argsOpnd[0], argsOpnd[1], argsOpnd[2], callInstr, labelHelper, labelHelper, doneLabel);
            break;

        default:
            Assert(UNREACHED);
    }

    IR::Instr *instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, doneLabel, this->m_func);
    labelHelper->InsertBefore(instr);

    return success;
}